

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O1

void __thiscall ADSBHubConnection::Stop(ADSBHubConnection *this,bool bWaitJoin)

{
  ssize_t sVar1;
  
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.thr._M_id._M_thread !=
      0) {
    if ((int)(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.eThrStatus < 3)
    {
      (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.eThrStatus = THR_STOP;
    }
    if (this->streamPipe[1] != -1) {
      sVar1 = write(this->streamPipe[1],"STOP",4);
      if (-1 < sVar1) goto LAB_0014ae53;
    }
    XPMP2::TCPConnection::Close(&this->tcpStream);
  }
LAB_0014ae53:
  LTChannel::Stop((LTChannel *)this,bWaitJoin);
  return;
}

Assistant:

void ADSBHubConnection::Stop (bool bWaitJoin)
{
    if (isRunning()) {
        if (eThrStatus < THR_STOP)
            eThrStatus = THR_STOP;          // indicate to the thread that it has to end itself
        
#if APL == 1 || LIN == 1
        // Mac/Lin: Try writing something to the self-pipe to stop gracefully
        if (streamPipe[1] == INVALID_SOCKET ||
            write(streamPipe[1], "STOP", 4) < 0)
        {
            // if the self-pipe didn't work:
#endif
            // close all connections, this will also break out of all
            // blocking calls for receiving message and hence terminate the threads
            tcpStream.Close();
#if APL == 1 || LIN == 1
        }
#endif
    }
    
    // Parent class processing: Wait for the thread to join
    LTFlightDataChannel::Stop(bWaitJoin);
}